

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O2

void __thiscall
duckdb::WriteAheadLog::WriteSetTable(WriteAheadLog *this,string *schema,string *table)

{
  WriteAheadLogSerializer serializer;
  
  WriteAheadLogSerializer::WriteAheadLogSerializer(&serializer,this,USE_TABLE);
  Serializer::WriteProperty<std::__cxx11::string>
            (&serializer.serializer.super_Serializer,0x65,"schema",schema);
  Serializer::WriteProperty<std::__cxx11::string>
            (&serializer.serializer.super_Serializer,0x66,"table",table);
  WriteAheadLogSerializer::End(&serializer);
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&serializer);
  return;
}

Assistant:

void WriteAheadLog::WriteSetTable(const string &schema, const string &table) {
	WriteAheadLogSerializer serializer(*this, WALType::USE_TABLE);
	serializer.WriteProperty(101, "schema", schema);
	serializer.WriteProperty(102, "table", table);
	serializer.End();
}